

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlSchemaBasicItemPtr
xmlSchemaParseElement
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node,int *isElemRef,
          int topLevel)

{
  xmlSchemaBucketPtr_conflict pxVar1;
  _xmlAttr *p_Var2;
  undefined1 *puVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  xmlAttrPtr pxVar7;
  xmlNodePtr pxVar8;
  xmlAttrPtr pxVar9;
  xmlSchemaTreeItemPtr pxVar10;
  xmlSchemaTypePtr attr;
  xmlSchemaParticlePtr item;
  xmlSchemaTreeItemPtr_conflict pxVar11;
  xmlAttrPtr pxVar12;
  xmlSchemaQNameRefPtr pxVar13;
  xmlNodePtr pxVar14;
  xmlChar *pxVar15;
  xmlSchemaTreeItemPtr pxVar16;
  xmlSchemaTypePtr pxVar17;
  xmlSchemaIDCPtr_conflict pxVar18;
  xmlSchemaTypeType idcCategory;
  xmlSchemaTreeItemPtr_conflict pxVar19;
  xmlSchemaTreeItemPtr_conflict pxVar20;
  xmlSchemaBasicItemPtr ownerComp;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr ownerComp_00;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaItemListPtr *list;
  undefined4 in_register_00000084;
  xmlSchemaTreeItemPtr *ppxVar21;
  char *pcVar22;
  char *in_R9;
  xmlChar **uri;
  xmlSchemaIDCPtr_conflict pxVar23;
  _xmlNode *node_00;
  xmlSchemaParserCtxtPtr ctxt_00;
  bool bVar24;
  xmlChar *name;
  xmlChar *ref;
  xmlChar **in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  xmlSchemaParserCtxtPtr pxVar25;
  undefined4 in_stack_ffffffffffffff80;
  xmlAttrPtr local_58;
  uint local_4c;
  xmlNodePtr local_48;
  _xmlNode *local_40;
  xmlNodePtr local_38;
  
  pcVar22 = (char *)CONCAT44(in_register_00000084,topLevel);
  if (isElemRef != (int *)0x0) {
    *isElemRef = 0;
  }
  pxVar14 = (xmlNodePtr)isElemRef;
  pxVar7 = xmlSchemaGetPropNode(node,"name");
  pxVar8 = (xmlNodePtr)xmlSchemaGetPropNode(node,"ref");
  bVar24 = topLevel != 0;
  if (pxVar7 == (xmlAttrPtr)0x0 && (pxVar8 == (xmlNodePtr)0x0 || bVar24)) {
    xmlSchemaPMissingAttrErr
              (ctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x1ce024,pxVar14,pcVar22,in_R9);
    return (xmlSchemaBasicItemPtr)0x0;
  }
  pxVar9 = xmlSchemaGetPropNode(node,"id");
  if (pxVar9 != (xmlAttrPtr)0x0) {
    xmlSchemaPValAttrNodeID(ctxt,pxVar9);
  }
  node_00 = node->children;
  if (node_00 == (xmlNodePtr)0x0) {
    node_00 = (xmlNodePtr)0x0;
LAB_00199368:
    pxVar10 = (xmlSchemaTreeItemPtr)0x0;
  }
  else {
    if (((node_00->ns == (xmlNs *)0x0) ||
        (iVar4 = xmlStrEqual(node_00->name,(xmlChar *)"annotation"), iVar4 == 0)) ||
       (iVar4 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
       iVar4 == 0)) goto LAB_00199368;
    pxVar10 = (xmlSchemaTreeItemPtr)xmlSchemaParseAnnotation(ctxt,node_00,1);
    node_00 = node_00->next;
  }
  pxVar25 = ctxt;
  if (topLevel == 0) {
    local_48 = node_00;
    local_38 = pxVar8;
    uVar6 = xmlGetMinOccurs(ctxt,node,-1,0x1e5d23,(int)pcVar22,in_R9);
    pcVar22 = "(xs:nonNegativeInteger | unbounded)";
    iVar4 = xmlGetMaxOccurs(ctxt,node,0,0x40000000,0x1e5d39,in_R9);
    xmlSchemaPCheckParticleCorrect_2
              (ctxt,(xmlSchemaParticlePtr)node,(xmlNodePtr)(ulong)uVar6,iVar4,(int)pcVar22);
    local_4c = uVar6;
    item = xmlSchemaAddParticle(ctxt,node,uVar6,iVar4);
    pxVar14 = local_38;
    if (item == (xmlSchemaParticlePtr)0x0) {
      item = (xmlSchemaParticlePtr)0x0;
    }
    else {
      node_00 = local_48;
      if (pxVar8 == (xmlNodePtr)0x0 || bVar24) goto LAB_0019937f;
      local_58 = (xmlAttrPtr)0x0;
      local_40 = (_xmlNode *)0x0;
      if (isElemRef != (int *)0x0) {
        *isElemRef = 1;
      }
      pxVar12 = (xmlAttrPtr)xmlSchemaGetNodeContent(pxVar25,local_38);
      pxVar9 = (xmlAttrPtr)&stack0xffffffffffffffa8;
      uri = (xmlChar **)&stack0xffffffffffffffc0;
      xmlSchemaPValAttrNodeQNameValue
                (pxVar25,schema,(xmlSchemaBasicItemPtr)pxVar14,pxVar12,(xmlChar *)pxVar9,uri,
                 in_stack_ffffffffffffff68);
      pxVar12 = local_58;
      xmlSchemaCheckReference(pxVar25,(xmlSchemaPtr)node,pxVar14,local_58,(xmlChar *)pxVar9);
      if (pxVar7 != (xmlAttrPtr)0x0) {
        pxVar9 = (xmlAttrPtr)0x1e3cf6;
        uri = (xmlChar **)0x1ce024;
        xmlSchemaPMutualExclAttrErr
                  (pxVar25,XML_SCHEMAP_SRC_ELEMENT_2_1,(xmlSchemaBasicItemPtr)0x0,pxVar7,"ref",
                   "name");
      }
      for (p_Var2 = node->properties; p_Var2 != (_xmlAttr *)0x0; p_Var2 = p_Var2->next) {
        if (p_Var2->ns == (xmlNs *)0x0) {
          iVar5 = xmlStrEqual(p_Var2->name,"ref");
          if (((iVar5 == 0) && (iVar5 = xmlStrEqual(p_Var2->name,"name"), iVar5 == 0)) &&
             ((iVar5 = xmlStrEqual(p_Var2->name,"id"), iVar5 == 0 &&
              ((iVar5 = xmlStrEqual(p_Var2->name,(xmlChar *)"maxOccurs"), iVar5 == 0 &&
               (iVar5 = xmlStrEqual(p_Var2->name,(xmlChar *)"minOccurs"), iVar5 == 0)))))) {
            xmlSchemaPCustomAttrErr
                      (pxVar25,XML_SCHEMAP_SRC_ELEMENT_2_2,(xmlChar **)p_Var2,
                       (xmlSchemaBasicItemPtr)
                       "Only the attributes \'minOccurs\', \'maxOccurs\' and \'id\' are allowed in addition to \'ref\'"
                       ,pxVar9,(char *)uri);
            break;
          }
        }
        else {
          iVar5 = xmlStrEqual(p_Var2->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
          if (iVar5 != 0) {
            xmlSchemaPIllegalAttrErr(pxVar25,(xmlParserErrors)p_Var2,ownerComp,pxVar7);
          }
        }
      }
      if (local_48 != (xmlNodePtr)0x0) {
        xmlSchemaPContentErr
                  (pxVar25,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,local_48,
                   (xmlNodePtr)0x0,"(annotation?)",(char *)in_stack_ffffffffffffff68);
      }
      if ((iVar4 != 0 || local_4c != 0) &&
         (pxVar13 = xmlSchemaNewQNameRef
                              (pxVar25,XML_SCHEMA_TYPE_ELEMENT,(xmlChar *)local_40,
                               (xmlChar *)pxVar12), pxVar13 != (xmlSchemaQNameRefPtr)0x0)) {
        item->children = (xmlSchemaTreeItemPtr_conflict)pxVar13;
        item->annot = (xmlSchemaAnnotPtr)pxVar10;
        iVar4 = xmlSchemaAddItemSize(&pxVar25->constructor->pending,10,item);
        if (-1 < iVar4) {
          return (xmlSchemaBasicItemPtr)item;
        }
        xmlSchemaPErrMemory(pxVar25);
        return (xmlSchemaBasicItemPtr)item;
      }
    }
    pxVar11 = (xmlSchemaTreeItemPtr_conflict)0x0;
    goto LAB_00199e9d;
  }
  item = (xmlSchemaParticlePtr)0x0;
LAB_0019937f:
  ctxt_00 = pxVar25;
  attr = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
  pxVar17 = (xmlSchemaTypePtr)&stack0xffffffffffffffa8;
  iVar5 = xmlSchemaPValAttrNode
                    (pxVar25,(xmlSchemaBasicItemPtr)pxVar7,(xmlAttrPtr)attr,pxVar17,
                     (xmlChar **)pcVar22);
  iVar4 = 3;
  if (iVar5 == 0) {
    if (topLevel == 0) {
      pxVar14 = (xmlNodePtr)xmlSchemaGetPropNode(node,"form");
      if (pxVar14 == (xmlNodePtr)0x0) {
        if ((schema->flags & 1) == 0) goto LAB_00199c82;
        goto LAB_00199464;
      }
      pxVar15 = xmlSchemaGetNodeContent(pxVar25,pxVar14);
      iVar5 = xmlStrEqual(pxVar15,"qualified");
      if (iVar5 != 0) goto LAB_00199464;
      iVar5 = xmlStrEqual(pxVar15,(xmlChar *)"unqualified");
      if (iVar5 == 0) {
        in_stack_ffffffffffffff68 = (xmlChar **)0x0;
        in_stack_ffffffffffffff70 = 0;
        pxVar17 = (xmlSchemaTypePtr)0x0;
        xmlSchemaPSimpleTypeErr
                  (ctxt_00,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar14,
                   (xmlNodePtr)0x0,(xmlSchemaTypePtr)"(qualified | unqualified)",(char *)pxVar15,
                   (xmlChar *)0x0,(char *)0x0,(xmlChar *)ctxt_00,
                   (xmlChar *)CONCAT44(topLevel,in_stack_ffffffffffffff80));
      }
LAB_00199c82:
      pxVar15 = (xmlChar *)0x0;
    }
    else {
LAB_00199464:
      pxVar15 = pxVar25->targetNamespace;
    }
    pxVar7 = local_58;
    if (local_58 == (xmlAttrPtr)0x0) {
      pxVar11 = (xmlSchemaTreeItemPtr_conflict)0x0;
    }
    else {
      pxVar11 = (xmlSchemaTreeItemPtr_conflict)(*xmlMalloc)(200);
      if (pxVar11 == (xmlSchemaTreeItemPtr_conflict)0x0) {
        pxVar11 = (xmlSchemaTreeItemPtr_conflict)0x0;
      }
      else {
        memset(pxVar11,0,200);
        pxVar11->type = XML_SCHEMA_TYPE_ELEMENT;
        pxVar11->next = (xmlSchemaTreeItemPtr)pxVar7;
        *(xmlChar **)(pxVar11 + 3) = pxVar15;
        pxVar11[2].annot = (xmlSchemaAnnotPtr)node;
        pxVar1 = ctxt_00->constructor->bucket;
        if (topLevel == 0) {
          list = &pxVar1->locals;
          iVar5 = 10;
        }
        else {
          list = &pxVar1->globals;
          iVar5 = 5;
        }
        iVar5 = xmlSchemaAddItemSize(list,iVar5,pxVar11);
        if (iVar5 < 0) {
          xmlSchemaPErrMemory(ctxt_00);
          (*xmlFree)(pxVar11);
          pxVar11 = (xmlSchemaTreeItemPtr_conflict)0x0;
        }
        if ((pxVar11 == (xmlSchemaTreeItemPtr_conflict)0x0) ||
           (iVar5 = xmlSchemaAddItemSize(&ctxt_00->constructor->pending,10,pxVar11), -1 < iVar5))
        goto LAB_0019979e;
      }
      xmlSchemaPErrMemory(ctxt_00);
    }
LAB_0019979e:
    iVar5 = (int)in_stack_ffffffffffffff70;
    if (pxVar11 == (xmlSchemaTreeItemPtr_conflict)0x0) {
      pxVar11 = (xmlSchemaTreeItemPtr_conflict)0x0;
    }
    else {
      for (p_Var2 = node->properties; p_Var2 != (_xmlAttr *)0x0; p_Var2 = p_Var2->next) {
        if (p_Var2->ns == (xmlNs *)0x0) {
          iVar4 = xmlStrEqual(p_Var2->name,"name");
          if ((((((iVar4 == 0) && (iVar4 = xmlStrEqual(p_Var2->name,"type"), iVar4 == 0)) &&
                (iVar4 = xmlStrEqual(p_Var2->name,"id"), iVar4 == 0)) &&
               ((iVar4 = xmlStrEqual(p_Var2->name,"default"), iVar4 == 0 &&
                (iVar4 = xmlStrEqual(p_Var2->name,(xmlChar *)"fixed"), iVar4 == 0)))) &&
              (iVar4 = xmlStrEqual(p_Var2->name,(xmlChar *)"block"), iVar4 == 0)) &&
             (iVar4 = xmlStrEqual(p_Var2->name,(xmlChar *)"nillable"), iVar4 == 0)) {
            if (topLevel == 0) {
              iVar4 = xmlStrEqual(p_Var2->name,(xmlChar *)"maxOccurs");
              if ((iVar4 == 0) &&
                 (iVar4 = xmlStrEqual(p_Var2->name,(xmlChar *)"minOccurs"), iVar4 == 0)) {
                pxVar15 = p_Var2->name;
                pcVar22 = "form";
                goto LAB_0019990c;
              }
            }
            else {
              iVar4 = xmlStrEqual(p_Var2->name,(xmlChar *)"final");
              if ((iVar4 == 0) && (iVar4 = xmlStrEqual(p_Var2->name,"abstract"), iVar4 == 0)) {
                pxVar15 = p_Var2->name;
                pcVar22 = "substitutionGroup";
LAB_0019990c:
                iVar4 = xmlStrEqual(pxVar15,(xmlChar *)pcVar22);
                ownerComp_00 = extraout_RDX_00;
                if (iVar4 == 0) goto LAB_001997ea;
              }
            }
          }
        }
        else {
          iVar4 = xmlStrEqual(p_Var2->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
          ownerComp_00 = extraout_RDX;
          if (iVar4 != 0) {
LAB_001997ea:
            xmlSchemaPIllegalAttrErr
                      (ctxt_00,(xmlParserErrors)p_Var2,ownerComp_00,(xmlAttrPtr)pxVar17);
          }
        }
        iVar5 = (int)in_stack_ffffffffffffff70;
      }
      pxVar19 = pxVar11;
      if (topLevel != 0) {
        *(byte *)&pxVar11[2].children = *(byte *)&pxVar11[2].children | 0x22;
        ppxVar21 = &pxVar11[2].children;
        iVar4 = 0x1e668a;
        xmlSchemaPValAttrQName
                  (ctxt_00,schema,(xmlSchemaBasicItemPtr)node,(xmlNodePtr)"substitutionGroup",
                   (char *)(pxVar11 + 4),(xmlChar **)&pxVar11[3].children,in_stack_ffffffffffffff68)
        ;
        iVar4 = xmlGetBooleanProp(ctxt_00,node,"abstract",iVar4);
        if (iVar4 != 0) {
          *(byte *)ppxVar21 = *(byte *)ppxVar21 | 0x10;
        }
        pxVar14 = (xmlNodePtr)xmlSchemaGetPropNode(node,"final");
        if (pxVar14 == (xmlNodePtr)0x0) {
          uVar6 = schema->flags;
          if ((uVar6 & 4) != 0) {
            puVar3 = (undefined1 *)((long)&pxVar11[2].children + 1);
            *puVar3 = *puVar3 | 0x80;
          }
          if ((uVar6 & 8) != 0) {
            puVar3 = (undefined1 *)((long)&pxVar11[2].children + 2);
            *puVar3 = *puVar3 | 1;
          }
        }
        else {
          pxVar15 = xmlSchemaGetNodeContent(ctxt_00,pxVar14);
          in_stack_ffffffffffffff68 =
               (xmlChar **)CONCAT44((int)((ulong)in_stack_ffffffffffffff68 >> 0x20),0xffffffff);
          iVar4 = xmlSchemaPValAttrBlockFinal(pxVar15,(int *)ppxVar21,0x8000,0x10000,-1,-1,-1,iVar5)
          ;
          if (iVar4 != 0) {
            in_stack_ffffffffffffff68 = (xmlChar **)0x0;
            iVar5 = 0;
            xmlSchemaPSimpleTypeErr
                      (ctxt_00,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar14,
                       (xmlNodePtr)0x0,
                       (xmlSchemaTypePtr)"(#all | List of (extension | restriction))",
                       (char *)pxVar15,(xmlChar *)0x0,(char *)0x0,(xmlChar *)pxVar19,
                       (xmlChar *)CONCAT44(topLevel,in_stack_ffffffffffffff80));
          }
        }
      }
      pxVar14 = (xmlNodePtr)xmlSchemaGetPropNode(node,"block");
      pxVar11 = pxVar19;
      if (pxVar14 == (xmlNodePtr)0x0) {
        uVar6 = schema->flags;
        if ((char)uVar6 < '\0') {
          puVar3 = (undefined1 *)((long)&pxVar19[2].children + 1);
          *puVar3 = *puVar3 | 0x10;
        }
        if ((uVar6 & 0x40) != 0) {
          puVar3 = (undefined1 *)((long)&pxVar19[2].children + 1);
          *puVar3 = *puVar3 | 8;
        }
        if ((uVar6 >> 8 & 1) != 0) {
          puVar3 = (undefined1 *)((long)&pxVar19[2].children + 1);
          *puVar3 = *puVar3 | 0x20;
        }
      }
      else {
        pxVar15 = xmlSchemaGetNodeContent(ctxt_00,pxVar14);
        in_stack_ffffffffffffff68 =
             (xmlChar **)CONCAT44((int)((ulong)in_stack_ffffffffffffff68 >> 0x20),0xffffffff);
        pxVar19 = (xmlSchemaTreeItemPtr_conflict)0x1000;
        iVar4 = xmlSchemaPValAttrBlockFinal
                          (pxVar15,(int *)&pxVar11[2].children,0x800,0x1000,0x2000,-1,-1,iVar5);
        if (iVar4 != 0) {
          in_stack_ffffffffffffff68 = (xmlChar **)0x0;
          pxVar19 = (xmlSchemaTreeItemPtr_conflict)0x0;
          xmlSchemaPSimpleTypeErr
                    (ctxt_00,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar14,
                     (xmlNodePtr)0x0,
                     (xmlSchemaTypePtr)"(#all | List of (extension | restriction | substitution))",
                     (char *)pxVar15,(xmlChar *)0x0,(char *)0x0,(xmlChar *)pxVar11,
                     (xmlChar *)CONCAT44(topLevel,in_stack_ffffffffffffff80));
        }
      }
      iVar4 = xmlGetBooleanProp(ctxt_00,node,"nillable",(int)pxVar19);
      if (iVar4 != 0) {
        *(byte *)&pxVar11[2].children = *(byte *)&pxVar11[2].children | 1;
      }
      pxVar14 = (xmlNodePtr)xmlSchemaGetPropNode(node,"type");
      pxVar19 = pxVar11;
      if (pxVar14 != (xmlNodePtr)0x0) {
        ppxVar21 = &pxVar11[3].next;
        pxVar7 = (xmlAttrPtr)xmlSchemaGetNodeContent(ctxt_00,pxVar14);
        xmlSchemaPValAttrNodeQNameValue
                  (ctxt_00,schema,(xmlSchemaBasicItemPtr)pxVar14,pxVar7,(xmlChar *)ppxVar21,
                   (xmlChar **)&pxVar11[3].annot,in_stack_ffffffffffffff68);
        xmlSchemaCheckReference
                  (ctxt_00,(xmlSchemaPtr)node,pxVar14,(xmlAttrPtr)pxVar11[3].next,
                   (xmlChar *)ppxVar21);
      }
      pxVar16 = (xmlSchemaTreeItemPtr)xmlSchemaGetProp(ctxt_00,node,"default");
      pxVar11[4].next = pxVar16;
      pxVar14 = (xmlNodePtr)xmlSchemaGetPropNode(node,"fixed");
      if (pxVar14 != (xmlNodePtr)0x0) {
        pxVar16 = (xmlSchemaTreeItemPtr)xmlSchemaGetNodeContent(ctxt_00,pxVar14);
        if (pxVar19[4].next == (xmlSchemaTreeItemPtr)0x0) {
          *(byte *)&pxVar19[2].children = *(byte *)&pxVar19[2].children | 8;
          pxVar19[4].next = pxVar16;
        }
        else {
          xmlSchemaPMutualExclAttrErr
                    (ctxt_00,XML_SCHEMAP_SRC_ELEMENT_1,(xmlSchemaBasicItemPtr)0x0,
                     (xmlAttrPtr)pxVar14,"default","fixed");
        }
      }
      pxVar11 = pxVar19;
      if (node_00 == (xmlNodePtr)0x0) {
        node_00 = (xmlNodePtr)0x0;
      }
      else if (((node_00->ns == (xmlNs *)0x0) ||
               (iVar4 = xmlStrEqual(node_00->name,(xmlChar *)"complexType"), iVar4 == 0)) ||
              (iVar4 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
              iVar4 == 0)) {
        if (((node_00->ns != (xmlNs *)0x0) &&
            (iVar4 = xmlStrEqual(node_00->name,"simpleType"), iVar4 != 0)) &&
           (iVar4 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar4 != 0)) {
          if (pxVar19[3].annot == (xmlSchemaAnnotPtr)0x0) {
            pxVar17 = xmlSchemaParseSimpleType(ctxt_00,schema,node_00,0);
            goto LAB_00199caf;
          }
          pcVar22 = "The attribute \'type\' and the <simpleType> child are mutually exclusive";
          goto LAB_00199c56;
        }
      }
      else {
        if (pxVar19[3].annot == (xmlSchemaAnnotPtr)0x0) {
          pxVar17 = xmlSchemaParseComplexType(ctxt_00,schema,node_00,0);
LAB_00199caf:
          pxVar19[1].children = (xmlSchemaTreeItemPtr)pxVar17;
        }
        else {
          pcVar22 = "The attribute \'type\' and the <complexType> child are mutually exclusive";
LAB_00199c56:
          xmlSchemaPContentErr
                    (ctxt_00,XML_SCHEMAP_SRC_ELEMENT_3,(xmlSchemaBasicItemPtr)node,node_00,
                     (xmlNodePtr)pcVar22,(char *)0x0,(char *)in_stack_ffffffffffffff68);
        }
        node_00 = node_00->next;
      }
      if (node_00 != (xmlNodePtr)0x0) {
        pxVar19 = pxVar11 + 6;
        pxVar23 = (xmlSchemaIDCPtr_conflict)0x0;
        do {
          if (((((node_00->ns == (xmlNs *)0x0) ||
                (iVar4 = xmlStrEqual(node_00->name,(xmlChar *)"unique"), iVar4 == 0)) ||
               (iVar4 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar4 == 0)) &&
              (((node_00->ns == (xmlNs *)0x0 ||
                (iVar4 = xmlStrEqual(node_00->name,(xmlChar *)"key"), iVar4 == 0)) ||
               (iVar4 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar4 == 0)))) &&
             (((node_00->ns == (xmlNs *)0x0 ||
               (iVar4 = xmlStrEqual(node_00->name,"keyref"), iVar4 == 0)) ||
              (iVar4 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
              iVar4 == 0)))) {
            xmlSchemaPContentErr
                      (ctxt_00,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,node_00,
                       (xmlNodePtr)0x0,
                       "(annotation?, ((simpleType | complexType)?, (unique | key | keyref)*))",
                       (char *)in_stack_ffffffffffffff68);
            break;
          }
          if ((node_00->ns == (xmlNs *)0x0) ||
             (iVar4 = xmlStrEqual(node_00->name,(xmlChar *)"unique"), iVar4 == 0)) {
LAB_00199da3:
            if ((node_00->ns != (xmlNs *)0x0) &&
               (iVar4 = xmlStrEqual(node_00->name,(xmlChar *)"key"), iVar4 != 0)) {
              iVar4 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
              idcCategory = XML_SCHEMA_TYPE_IDC_KEY;
              if (iVar4 != 0) goto LAB_00199e18;
            }
            pxVar18 = pxVar23;
            if ((node_00->ns != (xmlNs *)0x0) &&
               (iVar4 = xmlStrEqual(node_00->name,"keyref"), iVar4 != 0)) {
              iVar4 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
              idcCategory = XML_SCHEMA_TYPE_IDC_KEYREF;
              if (iVar4 != 0) goto LAB_00199e18;
            }
          }
          else {
            iVar4 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
            idcCategory = XML_SCHEMA_TYPE_IDC_UNIQUE;
            if (iVar4 == 0) goto LAB_00199da3;
LAB_00199e18:
            pxVar18 = xmlSchemaParseIDC(ctxt_00,schema,node_00,idcCategory,
                                        *(xmlChar **)(pxVar11 + 3));
          }
          pxVar20 = (xmlSchemaTreeItemPtr_conflict)&pxVar23->next;
          if (pxVar23 == (xmlSchemaIDCPtr_conflict)0x0) {
            pxVar20 = pxVar19;
          }
          *(xmlSchemaIDCPtr_conflict *)pxVar20 = pxVar18;
          node_00 = node_00->next;
          pxVar23 = pxVar18;
        } while (node_00 != (_xmlNode *)0x0);
      }
      pxVar11[1].next = pxVar10;
      iVar4 = 0;
    }
  }
  else {
    pxVar11 = (xmlSchemaTreeItemPtr_conflict)0x0;
    iVar4 = 3;
  }
  if (iVar4 != 3) {
    if (iVar4 != 0) {
      return (xmlSchemaBasicItemPtr)item;
    }
    if (topLevel != 0) {
      return (xmlSchemaBasicItemPtr)pxVar11;
    }
    item->children = pxVar11;
    return (xmlSchemaBasicItemPtr)item;
  }
LAB_00199e9d:
  if (pxVar10 != (xmlSchemaTreeItemPtr)0x0) {
    if (item != (xmlSchemaParticlePtr)0x0) {
      item->annot = (xmlSchemaAnnotPtr)0x0;
    }
    if (pxVar11 != (xmlSchemaTreeItemPtr_conflict)0x0) {
      pxVar11[1].next = (xmlSchemaTreeItemPtr)0x0;
    }
    if (*(_xmlSchemaAnnot **)&pxVar10->type != (_xmlSchemaAnnot *)0x0) {
      do {
        pxVar16 = *(xmlSchemaTreeItemPtr *)&pxVar10->type;
        (*xmlFree)(pxVar10);
        pxVar10 = pxVar16;
      } while (pxVar16 != (xmlSchemaTreeItemPtr)0x0);
      return (xmlSchemaBasicItemPtr)0x0;
    }
    (*xmlFree)(pxVar10);
  }
  return (xmlSchemaBasicItemPtr)0x0;
}

Assistant:

static xmlSchemaBasicItemPtr
xmlSchemaParseElement(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                      xmlNodePtr node, int *isElemRef, int topLevel)
{
    xmlSchemaElementPtr decl = NULL;
    xmlSchemaParticlePtr particle = NULL;
    xmlSchemaAnnotPtr annot = NULL;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr, nameAttr;
    int min, max, isRef = 0;
    xmlChar *des = NULL;

    /* 3.3.3 Constraints on XML Representations of Element Declarations */
    /* TODO: Complete implementation of 3.3.6 */

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    if (isElemRef != NULL)
	*isElemRef = 0;
    /*
    * If we get a "ref" attribute on a local <element> we will assume it's
    * a reference - even if there's a "name" attribute; this seems to be more
    * robust.
    */
    nameAttr = xmlSchemaGetPropNode(node, "name");
    attr = xmlSchemaGetPropNode(node, "ref");
    if ((topLevel) || (attr == NULL)) {
	if (nameAttr == NULL) {
	    xmlSchemaPMissingAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_MISSING,
		NULL, node, "name", NULL);
	    return (NULL);
	}
    } else
	isRef = 1;

    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
	annot = xmlSchemaParseAnnotation(ctxt, child, 1);
	child = child->next;
    }
    /*
    * Skip particle part if a global declaration.
    */
    if (topLevel)
	goto declaration_part;
    /*
    * The particle part ==================================================
    */
    min = xmlGetMinOccurs(ctxt, node, 0, -1, 1, "xs:nonNegativeInteger");
    max = xmlGetMaxOccurs(ctxt, node, 0, UNBOUNDED, 1, "(xs:nonNegativeInteger | unbounded)");
    xmlSchemaPCheckParticleCorrect_2(ctxt, NULL, node, min, max);
    particle = xmlSchemaAddParticle(ctxt, node, min, max);
    if (particle == NULL)
	goto return_null;

    /* ret->flags |= XML_SCHEMAS_ELEM_REF; */

    if (isRef) {
	const xmlChar *refNs = NULL, *ref = NULL;
	xmlSchemaQNameRefPtr refer = NULL;
	/*
	* The reference part =============================================
	*/
	if (isElemRef != NULL)
	    *isElemRef = 1;

	xmlSchemaPValAttrNodeQName(ctxt, schema,
	    NULL, attr, &refNs, &ref);
	xmlSchemaCheckReference(ctxt, schema, node, attr, refNs);
	/*
	* SPEC (3.3.3 : 2.1) "One of ref or name must be present, but not both"
	*/
	if (nameAttr != NULL) {
	    xmlSchemaPMutualExclAttrErr(ctxt,
		XML_SCHEMAP_SRC_ELEMENT_2_1, NULL, nameAttr, "ref", "name");
	}
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if (xmlStrEqual(attr->name, BAD_CAST "ref") ||
		    xmlStrEqual(attr->name, BAD_CAST "name") ||
		    xmlStrEqual(attr->name, BAD_CAST "id") ||
		    xmlStrEqual(attr->name, BAD_CAST "maxOccurs") ||
		    xmlStrEqual(attr->name, BAD_CAST "minOccurs"))
		{
		    attr = attr->next;
		    continue;
		} else {
		    /* SPEC (3.3.3 : 2.2) */
		    xmlSchemaPCustomAttrErr(ctxt,
			XML_SCHEMAP_SRC_ELEMENT_2_2,
			NULL, NULL, attr,
			"Only the attributes 'minOccurs', 'maxOccurs' and "
			"'id' are allowed in addition to 'ref'");
		    break;
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
	/*
	* No children except <annotation> expected.
	*/
	if (child != NULL) {
	    xmlSchemaPContentErr(ctxt, XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child, NULL, "(annotation?)");
	}
	if ((min == 0) && (max == 0))
	    goto return_null;
	/*
	* Create the reference item and attach it to the particle.
	*/
	refer = xmlSchemaNewQNameRef(ctxt, XML_SCHEMA_TYPE_ELEMENT,
	    ref, refNs);
	if (refer == NULL)
	    goto return_null;
	particle->children = (xmlSchemaTreeItemPtr) refer;
	particle->annot = annot;
	/*
	* Add the particle to pending components, since the reference
	* need to be resolved.
	*/
	WXS_ADD_PENDING(ctxt, particle);
	return ((xmlSchemaBasicItemPtr) particle);
    }
    /*
    * The declaration part ===============================================
    */
declaration_part:
    {
	const xmlChar *ns = NULL, *fixed, *name, *attrValue;
	xmlSchemaIDCPtr curIDC = NULL, lastIDC = NULL;

	if (xmlSchemaPValAttrNode(ctxt, NULL, nameAttr,
	    xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME), &name) != 0)
	    goto return_null;
	/*
	* Evaluate the target namespace.
	*/
	if (topLevel) {
	    ns = ctxt->targetNamespace;
	} else {
	    attr = xmlSchemaGetPropNode(node, "form");
	    if (attr != NULL) {
		attrValue = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
		if (xmlStrEqual(attrValue, BAD_CAST "qualified")) {
		    ns = ctxt->targetNamespace;
		} else if (!xmlStrEqual(attrValue, BAD_CAST "unqualified")) {
		    xmlSchemaPSimpleTypeErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
			NULL, (xmlNodePtr) attr,
			NULL, "(qualified | unqualified)",
			attrValue, NULL, NULL, NULL);
		}
	    } else if (schema->flags & XML_SCHEMAS_QUALIF_ELEM)
		ns = ctxt->targetNamespace;
	}
	decl = xmlSchemaAddElement(ctxt, name, ns, node, topLevel);
	if (decl == NULL) {
	    goto return_null;
	}
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if ((!xmlStrEqual(attr->name, BAD_CAST "name")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "type")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "id")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "default")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "fixed")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "block")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "nillable")))
		{
		    if (topLevel == 0) {
			if ((!xmlStrEqual(attr->name, BAD_CAST "maxOccurs")) &&
			    (!xmlStrEqual(attr->name, BAD_CAST "minOccurs")) &&
			    (!xmlStrEqual(attr->name, BAD_CAST "form")))
			{
			    xmlSchemaPIllegalAttrErr(ctxt,
				XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
			}
		    } else if ((!xmlStrEqual(attr->name, BAD_CAST "final")) &&
			(!xmlStrEqual(attr->name, BAD_CAST "abstract")) &&
			(!xmlStrEqual(attr->name, BAD_CAST "substitutionGroup"))) {

			xmlSchemaPIllegalAttrErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		    }
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {

		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
	/*
	* Extract/validate attributes.
	*/
	if (topLevel) {
	    /*
	    * Process top attributes of global element declarations here.
	    */
	    decl->flags |= XML_SCHEMAS_ELEM_GLOBAL;
	    decl->flags |= XML_SCHEMAS_ELEM_TOPLEVEL;
	    xmlSchemaPValAttrQName(ctxt, schema,
		NULL, node, "substitutionGroup",
		&(decl->substGroupNs), &(decl->substGroup));
	    if (xmlGetBooleanProp(ctxt, node, "abstract", 0))
		decl->flags |= XML_SCHEMAS_ELEM_ABSTRACT;
	    /*
	    * Attribute "final".
	    */
	    attr = xmlSchemaGetPropNode(node, "final");
	    if (attr == NULL) {
		if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_EXTENSION)
		    decl->flags |= XML_SCHEMAS_ELEM_FINAL_EXTENSION;
		if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_RESTRICTION)
		    decl->flags |= XML_SCHEMAS_ELEM_FINAL_RESTRICTION;
	    } else {
		attrValue = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
		if (xmlSchemaPValAttrBlockFinal(attrValue, &(decl->flags),
		    -1,
		    XML_SCHEMAS_ELEM_FINAL_EXTENSION,
		    XML_SCHEMAS_ELEM_FINAL_RESTRICTION, -1, -1, -1) != 0) {
		    xmlSchemaPSimpleTypeErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
			NULL, (xmlNodePtr) attr,
			NULL, "(#all | List of (extension | restriction))",
			attrValue, NULL, NULL, NULL);
		}
	    }
	}
	/*
	* Attribute "block".
	*/
	attr = xmlSchemaGetPropNode(node, "block");
	if (attr == NULL) {
	    /*
	    * Apply default "block" values.
	    */
	    if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_RESTRICTION)
		decl->flags |= XML_SCHEMAS_ELEM_BLOCK_RESTRICTION;
	    if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_EXTENSION)
		decl->flags |= XML_SCHEMAS_ELEM_BLOCK_EXTENSION;
	    if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_SUBSTITUTION)
		decl->flags |= XML_SCHEMAS_ELEM_BLOCK_SUBSTITUTION;
	} else {
	    attrValue = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
	    if (xmlSchemaPValAttrBlockFinal(attrValue, &(decl->flags),
		-1,
		XML_SCHEMAS_ELEM_BLOCK_EXTENSION,
		XML_SCHEMAS_ELEM_BLOCK_RESTRICTION,
		XML_SCHEMAS_ELEM_BLOCK_SUBSTITUTION, -1, -1) != 0) {
		xmlSchemaPSimpleTypeErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
		    NULL, (xmlNodePtr) attr,
		    NULL, "(#all | List of (extension | "
		    "restriction | substitution))", attrValue,
		    NULL, NULL, NULL);
	    }
	}
	if (xmlGetBooleanProp(ctxt, node, "nillable", 0))
	    decl->flags |= XML_SCHEMAS_ELEM_NILLABLE;

	attr = xmlSchemaGetPropNode(node, "type");
	if (attr != NULL) {
	    xmlSchemaPValAttrNodeQName(ctxt, schema,
		NULL, attr,
		&(decl->namedTypeNs), &(decl->namedType));
	    xmlSchemaCheckReference(ctxt, schema, node,
		attr, decl->namedTypeNs);
	}
	decl->value = xmlSchemaGetProp(ctxt, node, "default");
	attr = xmlSchemaGetPropNode(node, "fixed");
	if (attr != NULL) {
	    fixed = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
	    if (decl->value != NULL) {
		/*
		* 3.3.3 : 1
		* default and fixed must not both be present.
		*/
		xmlSchemaPMutualExclAttrErr(ctxt,
		    XML_SCHEMAP_SRC_ELEMENT_1,
		    NULL, attr, "default", "fixed");
	    } else {
		decl->flags |= XML_SCHEMAS_ELEM_FIXED;
		decl->value = fixed;
	    }
	}
	/*
	* And now for the children...
	*/
	if (IS_SCHEMA(child, "complexType")) {
	    /*
	    * 3.3.3 : 3
	    * "type" and either <simpleType> or <complexType> are mutually
	    * exclusive
	    */
	    if (decl->namedType != NULL) {
		xmlSchemaPContentErr(ctxt,
		    XML_SCHEMAP_SRC_ELEMENT_3,
		    NULL, node, child,
		    "The attribute 'type' and the <complexType> child are "
		    "mutually exclusive", NULL);
	    } else
		WXS_ELEM_TYPEDEF(decl) = xmlSchemaParseComplexType(ctxt, schema, child, 0);
	    child = child->next;
	} else if (IS_SCHEMA(child, "simpleType")) {
	    /*
	    * 3.3.3 : 3
	    * "type" and either <simpleType> or <complexType> are
	    * mutually exclusive
	    */
	    if (decl->namedType != NULL) {
		xmlSchemaPContentErr(ctxt,
		    XML_SCHEMAP_SRC_ELEMENT_3,
		    NULL, node, child,
		    "The attribute 'type' and the <simpleType> child are "
		    "mutually exclusive", NULL);
	    } else
		WXS_ELEM_TYPEDEF(decl) = xmlSchemaParseSimpleType(ctxt, schema, child, 0);
	    child = child->next;
	}
	while ((IS_SCHEMA(child, "unique")) ||
	    (IS_SCHEMA(child, "key")) || (IS_SCHEMA(child, "keyref"))) {
	    if (IS_SCHEMA(child, "unique")) {
		curIDC = xmlSchemaParseIDC(ctxt, schema, child,
		    XML_SCHEMA_TYPE_IDC_UNIQUE, decl->targetNamespace);
	    } else if (IS_SCHEMA(child, "key")) {
		curIDC = xmlSchemaParseIDC(ctxt, schema, child,
		    XML_SCHEMA_TYPE_IDC_KEY, decl->targetNamespace);
	    } else if (IS_SCHEMA(child, "keyref")) {
		curIDC = xmlSchemaParseIDC(ctxt, schema, child,
		    XML_SCHEMA_TYPE_IDC_KEYREF, decl->targetNamespace);
	    }
	    if (lastIDC != NULL)
		lastIDC->next = curIDC;
	    else
		decl->idcs = (void *) curIDC;
	    lastIDC = curIDC;
	    child = child->next;
	}
	if (child != NULL) {
	    xmlSchemaPContentErr(ctxt,
		XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child,
		NULL, "(annotation?, ((simpleType | complexType)?, "
		"(unique | key | keyref)*))");
	}
	decl->annot = annot;
    }
    /*
    * NOTE: Element Declaration Representation OK 4. will be checked at a
    * different layer.
    */
    FREE_AND_NULL(des)
    if (topLevel)
	return ((xmlSchemaBasicItemPtr) decl);
    else {
	particle->children = (xmlSchemaTreeItemPtr) decl;
	return ((xmlSchemaBasicItemPtr) particle);
    }

return_null:
    FREE_AND_NULL(des);
    if (annot != NULL) {
	if (particle != NULL)
	    particle->annot = NULL;
	if (decl != NULL)
	    decl->annot = NULL;
	xmlSchemaFreeAnnot(annot);
    }
    return (NULL);
}